

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

bool __thiscall Board::load(Board *this,string *path)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  value_type local_2f8;
  Tile t;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  vector<Tile,_std::allocator<Tile>_> tiles;
  undefined1 local_298 [8];
  regex nonNumeric;
  undefined8 local_270;
  undefined1 local_268 [16];
  undefined4 local_258;
  undefined1 local_248 [8];
  string buffer;
  ifstream stream;
  string *path_local;
  Board *this_local;
  
  std::ifstream::ifstream((undefined1 *)((long)&buffer.field_2 + 8),path,8);
  std::__cxx11::string::string((string *)local_248);
  bVar1 = std::ios::operator!((ios *)((long)&buffer.field_2 +
                                     *(long *)(buffer.field_2._8_8_ + -0x18) + 8));
  if ((bVar1 & 1) == 0) {
    std::istream::seekg((long)((long)&buffer.field_2 + 8),_S_beg);
    local_268 = std::istream::tellg();
    std::fpos::operator_cast_to_long((fpos *)local_268);
    std::__cxx11::string::resize((ulong)local_248);
    std::fpos<__mbstate_t>::fpos
              ((fpos<__mbstate_t> *)
               &nonNumeric._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,0);
    std::istream::seekg((undefined1 *)((long)&buffer.field_2 + 8),
                        nonNumeric._M_automaton.
                        super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi,local_270);
    lVar3 = std::__cxx11::string::operator[]((ulong)local_248);
    std::__cxx11::string::size();
    std::istream::read(buffer.field_2._M_local_buf + 8,lVar3);
    std::ifstream::close();
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_298,"[^0-9]",0x10);
    std::
    regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &tiles.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_298,"",0);
    std::__cxx11::string::operator=
              ((string *)local_248,
               (string *)
               &tiles.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &tiles.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    lVar3 = std::__cxx11::string::size();
    if (lVar3 == 0x51) {
      std::vector<Tile,_std::allocator<Tile>_>::vector
                ((vector<Tile,_std::allocator<Tile>_> *)&__range1);
      __end1._M_current = (char *)std::__cxx11::string::begin();
      c = (char *)std::__cxx11::string::end();
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&c);
        if (!bVar2) break;
        t = (Tile)__gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end1);
        memset(&local_2f8,0,8);
        local_2f8.value = (int)*(char *)t - 0x30;
        local_2f8.status = (TileStatus)(local_2f8.value != Empty);
        std::vector<Tile,_std::allocator<Tile>_>::push_back
                  ((vector<Tile,_std::allocator<Tile>_> *)&__range1,&local_2f8);
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end1);
      }
      std::vector<Tile,_std::allocator<Tile>_>::operator=
                (&this->_tiles,(vector<Tile,_std::allocator<Tile>_> *)&__range1);
      this_local._7_1_ = true;
      local_258 = 1;
      std::vector<Tile,_std::allocator<Tile>_>::~vector
                ((vector<Tile,_std::allocator<Tile>_> *)&__range1);
    }
    else {
      this_local._7_1_ = false;
      local_258 = 1;
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_298);
  }
  else {
    this_local._7_1_ = false;
    local_258 = 1;
  }
  std::__cxx11::string::~string((string *)local_248);
  std::ifstream::~ifstream((void *)((long)&buffer.field_2 + 8));
  return this_local._7_1_;
}

Assistant:

bool Board::load(const std::string &path)
{
	std::ifstream stream(path);
	std::string buffer;

	if (!stream)
		return false;

	stream.seekg(0, std::ios::end);
	buffer.resize(stream.tellg());
	stream.seekg(0);
	stream.read(&buffer[0], buffer.size());
	stream.close();

	std::regex nonNumeric("[^0-9]");

	buffer = std::regex_replace(buffer, nonNumeric, "");

	if (buffer.size() != 81)
		return false;

	std::vector<Tile> tiles;

	for (auto &c : buffer)
	{
		auto t = Tile{};
		t.value = (TileValue)(c - '0');

		if (t.value == TileValue::Empty)
			t.status = TileStatus::Empty;
		else
			t.status = TileStatus::Solved;

		tiles.push_back(t);
	}

	_tiles = tiles;
	return true;
}